

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

void __thiscall
CGL::HalfedgeMesh::build
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *polygons,vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *vertexPositions,
          vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> *texcoords)

{
  list<CGL::Vertex,_std::allocator<CGL::Vertex>_> *this_00;
  list<CGL::Edge,_std::allocator<CGL::Edge>_> *this_01;
  list<CGL::Face,_std::allocator<CGL::Face>_> *this_02;
  list<CGL::Face,_std::allocator<CGL::Face>_> *this_03;
  size_t *psVar1;
  undefined8 *puVar2;
  _Rb_tree_header *p_Var3;
  pointer puVar4;
  unsigned_long uVar5;
  HalfedgeMesh *pHVar6;
  HalfedgeMesh *pHVar7;
  pointer pVVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> *pvVar12;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar13;
  vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *pvVar14;
  _Self __tmp;
  mapped_type *pmVar15;
  mapped_type *pmVar16;
  pointer pvVar17;
  iterator iVar18;
  _Base_ptr p_Var19;
  mapped_type *pmVar20;
  EdgeIter EVar21;
  long lVar22;
  FaceIter FVar23;
  _List_node_base *p_Var24;
  ostream *poVar25;
  _Base_ptr p_Var26;
  _Rb_tree_header *p_Var27;
  ulong uVar28;
  _List_node_base *p_Var29;
  long lVar30;
  HalfedgeMesh *pHVar31;
  mapped_type mVar32;
  long lVar33;
  pointer puVar34;
  pointer pvVar35;
  bool bVar36;
  HalfedgeIter hab;
  VertexIter v;
  IndexPair ab;
  Index a;
  map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
  pairToHalfedge;
  map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
  indexToVertex;
  IndexPair ba;
  map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
  vertexDegree;
  _List_iterator<CGL::Halfedge> local_150;
  key_type local_148;
  iterator iStack_140;
  _List_iterator<CGL::Halfedge> *local_138;
  _List_node_base *local_130;
  key_type local_128;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_118;
  _List_node_base *local_110;
  _List_node_base *local_108;
  vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *local_100;
  _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
  local_f8;
  vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> *local_c8;
  pointer local_c0;
  pointer local_b8;
  _Base_ptr local_b0;
  long local_a8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
  local_a0;
  key_type local_70;
  _Rb_tree<std::_List_iterator<CGL::Vertex>,_std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>,_std::_Select1st<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
  local_60;
  
  local_100 = vertexPositions;
  local_c8 = texcoords;
  std::__cxx11::_List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>::_M_clear
            ((_List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_> *)this);
  (this->halfedges).super__List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (this->halfedges).super__List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  (this->halfedges).super__List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>._M_impl._M_node.
  _M_size = 0;
  this_00 = &this->vertices;
  std::__cxx11::_List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>::_M_clear
            (&this_00->super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>);
  (this->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl._M_node.
  _M_size = 0;
  this_01 = &this->edges;
  local_110 = (_List_node_base *)this_00;
  std::__cxx11::_List_base<CGL::Edge,_std::allocator<CGL::Edge>_>::_M_clear
            (&this_01->super__List_base<CGL::Edge,_std::allocator<CGL::Edge>_>);
  (this->edges).super__List_base<CGL::Edge,_std::allocator<CGL::Edge>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_01;
  (this->edges).super__List_base<CGL::Edge,_std::allocator<CGL::Edge>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_01;
  (this->edges).super__List_base<CGL::Edge,_std::allocator<CGL::Edge>_>._M_impl._M_node._M_size = 0;
  this_02 = &this->faces;
  std::__cxx11::_List_base<CGL::Face,_std::allocator<CGL::Face>_>::_M_clear
            (&this_02->super__List_base<CGL::Face,_std::allocator<CGL::Face>_>);
  (this->faces).super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_02;
  (this->faces).super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_02;
  (this->faces).super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node._M_size = 0;
  this_03 = &this->boundaries;
  local_130 = (_List_node_base *)this_02;
  std::__cxx11::_List_base<CGL::Face,_std::allocator<CGL::Face>_>::_M_clear
            (&this_03->super__List_base<CGL::Face,_std::allocator<CGL::Face>_>);
  (this->boundaries).super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_03;
  (this->boundaries).super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_03;
  (this->boundaries).super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node._M_size
       = 0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar35 = (polygons->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar17 = (polygons->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_118 = polygons;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pvVar35 != pvVar17) {
    do {
      if ((ulong)((long)(pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start) < 0x11) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: each polygon must have at least three vertices."
                   ,0x5b);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0011d861;
      }
      local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_f8._M_impl.super__Rb_tree_header._M_header;
      local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
      for (puVar34 = (pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          puVar4 = (pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish, puVar34 != puVar4;
          puVar34 = puVar34 + 1) {
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&local_f8,puVar34);
        p_Var19 = &local_a0._M_impl.super__Rb_tree_header._M_header;
        if (local_a0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var26 = local_a0._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (*(ulong *)(p_Var26 + 1) >= *puVar34) {
              p_Var19 = p_Var26;
            }
            p_Var26 = (&p_Var26->_M_left)[*(ulong *)(p_Var26 + 1) < *puVar34];
          } while (p_Var26 != (_Base_ptr)0x0);
        }
        p_Var3 = &local_a0._M_impl.super__Rb_tree_header;
        p_Var27 = p_Var3;
        if (((_Rb_tree_header *)p_Var19 != p_Var3) &&
           (p_Var27 = (_Rb_tree_header *)p_Var19,
           *puVar34 < ((_Rb_tree_header *)p_Var19)->_M_node_count)) {
          p_Var27 = p_Var3;
        }
        if (p_Var27 == p_Var3) {
          std::__cxx11::list<CGL::Vertex,_std::allocator<CGL::Vertex>_>::_M_insert<>
                    ((list<CGL::Vertex,_std::allocator<CGL::Vertex>_> *)local_110,
                     (iterator)local_110);
          local_148._M_node =
               (this->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
          local_148._M_node[0x14]._M_next = (_List_node_base *)this;
          pmVar15 = std::
                    map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                    ::operator[]((map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                                  *)&local_a0,puVar34);
          pmVar15->_M_node = local_148._M_node;
          pmVar16 = std::
                    map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
                    ::operator[]((map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
                                  *)&local_60,&local_148);
          *pmVar16 = 1;
        }
        else {
          pmVar15 = std::
                    map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                    ::operator[]((map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                                  *)&local_a0,puVar34);
          pmVar16 = std::
                    map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
                    ::operator[]((map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
                                  *)&local_60,pmVar15);
          *pmVar16 = *pmVar16 + 1;
        }
      }
      if (local_f8._M_impl.super__Rb_tree_header._M_node_count <
          (ulong)((long)puVar4 -
                  (long)(pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: one of the input polygons does not have distinct vertices!"
                   ,0x66);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"(vertex indices:",0x10);
        puVar34 = (pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (puVar34 !=
            (pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            puVar34 = puVar34 + 1;
          } while (puVar34 !=
                   (pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,")",1);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0011d861;
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&local_f8);
      pvVar35 = pvVar35 + 1;
      pvVar17 = (local_118->
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    } while (pvVar35 != pvVar17);
  }
  pvVar13 = local_118;
  std::__cxx11::list<CGL::Face,_std::allocator<CGL::Face>_>::resize
            ((list<CGL::Face,_std::allocator<CGL::Face>_> *)local_130,
             ((long)pvVar17 -
              (long)(local_118->
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8._M_impl.super__Rb_tree_header._M_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar35 = (pvVar13->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pvVar35 !=
      (pvVar13->
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_b0 = (_Base_ptr)&PTR__HalfedgeElement_002a5308;
    do {
      local_130 = local_130->_M_next;
      local_148._M_node = (_List_node_base *)0x0;
      iStack_140._M_current = (_List_iterator<CGL::Halfedge> *)0x0;
      local_138 = (_List_iterator<CGL::Halfedge> *)0x0;
      local_b8 = (pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      local_c0 = (pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      lVar33 = (long)local_c0 - (long)local_b8 >> 3;
      if (local_c0 != local_b8) {
        local_a8 = -(ulong)(lVar33 == 0) - lVar33;
        lVar30 = 1;
        do {
          puVar34 = (pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          local_128.first = puVar34[lVar30 + -1];
          lVar22 = 0;
          if (lVar33 != lVar30) {
            lVar22 = lVar30;
          }
          uVar5 = puVar34[lVar22];
          local_150._M_node = (_List_node_base *)0x0;
          local_128.second = uVar5;
          local_108 = (_List_node_base *)local_128.first;
          iVar18 = std::
                   _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
                   ::find(&local_f8,&local_128);
          if ((_Rb_tree_header *)iVar18._M_node != &local_f8._M_impl.super__Rb_tree_header) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "Error converting polygons to halfedge mesh: found multiple oriented edges with indices ("
                       ,0x58);
            poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
            poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
            std::__ostream_insert<char,std::char_traits<char>>(poVar25,").",2);
            std::endl<char,std::char_traits<char>>(poVar25);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "This means that either (i) more than two faces contain this edge (hence the surface is nonmanifold), or"
                       ,0x67);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "(ii) there are exactly two faces containing this edge, but they have the same orientation (hence the surface is"
                       ,0x6f);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"not consistently oriented.",0x1a);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            goto LAB_0011d861;
          }
          p_Var19 = (_Base_ptr)operator_new(0x40);
          p_Var19->_M_left = local_b0;
          p_Var19->_M_right = (_Base_ptr)0x0;
          *(_List_node_base **)&p_Var19[1]._M_color = (_List_node_base *)0x0;
          p_Var19[1]._M_parent = (_Base_ptr)0x0;
          p_Var19[1]._M_left = (_Base_ptr)0x0;
          p_Var19[1]._M_right = (_Base_ptr)0x0;
          std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var19);
          psVar1 = &(this->halfedges).
                    super__List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>._M_impl._M_node.
                    _M_size;
          *psVar1 = *psVar1 + 1;
          local_150._M_node = (_List_node_base *)p_Var19;
          pmVar20 = std::
                    map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
                    ::operator[]((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
                                  *)&local_f8,&local_128);
          pmVar20->_M_node = local_150._M_node;
          local_150._M_node[3]._M_prev = local_130;
          local_130[10]._M_next = local_150._M_node;
          pmVar15 = std::
                    map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                    ::operator[]((map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                                  *)&local_a0,(key_type *)&local_108);
          p_Var19 = (_Base_ptr)pmVar15->_M_node;
          ((_Base_ptr)(local_150._M_node + 2))->_M_parent = p_Var19;
          *(_List_node_base **)&p_Var19[10]._M_color = local_150._M_node;
          if (iStack_140._M_current == local_138) {
            std::
            vector<std::_List_iterator<CGL::Halfedge>,std::allocator<std::_List_iterator<CGL::Halfedge>>>
            ::_M_realloc_insert<std::_List_iterator<CGL::Halfedge>const&>
                      ((vector<std::_List_iterator<CGL::Halfedge>,std::allocator<std::_List_iterator<CGL::Halfedge>>>
                        *)&local_148,iStack_140,&local_150);
          }
          else {
            (iStack_140._M_current)->_M_node = local_150._M_node;
            iStack_140._M_current = iStack_140._M_current + 1;
          }
          local_70.second = (unsigned_long)local_108;
          local_70.first = uVar5;
          iVar18 = std::
                   _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
                   ::find(&local_f8,&local_70);
          if ((_Rb_tree_header *)iVar18._M_node == &local_f8._M_impl.super__Rb_tree_header) {
            local_150._M_node[1]._M_prev = (_List_node_base *)this;
          }
          else {
            p_Var19 = iVar18._M_node[1]._M_left;
            local_150._M_node[1]._M_prev = (_List_node_base *)p_Var19;
            p_Var19->_M_right = (_Base_ptr)local_150._M_node;
            EVar21 = newEdge(this);
            local_150._M_node[3]._M_next = EVar21._M_node;
            p_Var19[1]._M_left = (_Base_ptr)EVar21._M_node;
            EVar21._M_node[9]._M_next = local_150._M_node;
          }
          lVar22 = local_a8 + lVar30;
          lVar30 = lVar30 + 1;
        } while (lVar22 != 0);
      }
      pvVar13 = local_118;
      if (local_c0 != local_b8) {
        lVar30 = 1;
        do {
          lVar22 = 0;
          if (lVar33 != lVar30) {
            lVar22 = lVar30;
          }
          *(_List_node_base **)(*(long *)((long)local_148._M_node + lVar30 * 8 + -8) + 0x20) =
               (&(local_148._M_node)->_M_next)[lVar22];
          lVar22 = (-(ulong)(lVar33 == 0) - lVar33) + lVar30;
          lVar30 = lVar30 + 1;
        } while (lVar22 != 0);
      }
      if (local_148._M_node != (_List_node_base *)0x0) {
        operator_delete(local_148._M_node);
      }
      pvVar35 = pvVar35 + 1;
    } while (pvVar35 !=
             (pvVar13->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  for (p_Var24 = local_110->_M_next; p_Var24 != local_110; p_Var24 = p_Var24->_M_next) {
    p_Var29 = p_Var24[0x14]._M_next;
    do {
      if ((HalfedgeMesh *)p_Var29[1]._M_prev == this) {
        p_Var24[0x14]._M_next = p_Var29;
        break;
      }
      p_Var29 = (((HalfedgeMesh *)p_Var29[1]._M_prev)->vertices).
                super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl._M_node.
                super__List_node_base._M_prev;
    } while (p_Var24[0x14]._M_next != p_Var29);
  }
  p_Var24 = local_110;
  pvVar12 = local_c8;
  for (pHVar6 = (HalfedgeMesh *)
                (this->halfedges).super__List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>.
                _M_impl._M_node.super__List_node_base._M_next; local_110 = p_Var24,
      local_c8 = pvVar12, pHVar6 != this;
      pHVar6 = (HalfedgeMesh *)
               (pHVar6->halfedges).super__List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>.
               _M_impl._M_node.super__List_node_base._M_next) {
    if ((HalfedgeMesh *)
        (pHVar6->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl.
        _M_node.super__List_node_base._M_next == this) {
      FVar23 = newBoundary(this);
      local_148._M_node = (_List_node_base *)0x0;
      iStack_140._M_current = (_List_iterator<CGL::Halfedge> *)0x0;
      local_138 = (_List_iterator<CGL::Halfedge> *)0x0;
      pHVar31 = pHVar6;
      do {
        p_Var24 = (_List_node_base *)operator_new(0x40);
        p_Var24[1]._M_next = (_List_node_base *)&PTR__HalfedgeElement_002a5308;
        p_Var24[1]._M_prev = (_List_node_base *)0x0;
        p_Var24[2]._M_next = (_List_node_base *)0x0;
        p_Var24[2]._M_prev = (_List_node_base *)0x0;
        p_Var24[3]._M_next = (_List_node_base *)0x0;
        p_Var24[3]._M_prev = (_List_node_base *)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var24);
        psVar1 = &(this->halfedges).super__List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        local_128.first = (unsigned_long)p_Var24;
        if (iStack_140._M_current == local_138) {
          std::
          vector<std::_List_iterator<CGL::Halfedge>,std::allocator<std::_List_iterator<CGL::Halfedge>>>
          ::_M_realloc_insert<std::_List_iterator<CGL::Halfedge>const&>
                    ((vector<std::_List_iterator<CGL::Halfedge>,std::allocator<std::_List_iterator<CGL::Halfedge>>>
                      *)&local_148,iStack_140,(_List_iterator<CGL::Halfedge> *)&local_128);
        }
        else {
          (iStack_140._M_current)->_M_node = p_Var24;
          iStack_140._M_current = iStack_140._M_current + 1;
        }
        (pHVar31->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl.
        _M_node.super__List_node_base._M_next = (_List_node_base *)local_128.first;
        ((_List_node_base *)(local_128.first + 0x10))->_M_prev = (_List_node_base *)pHVar31;
        ((_List_node_base *)(local_128.first + 0x30))->_M_prev = FVar23._M_node;
        ((_List_node_base *)(local_128.first + 0x20))->_M_prev =
             (pHVar31->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl
             ._M_node.super__List_node_base._M_prev[2]._M_prev;
        EVar21 = newEdge(this);
        EVar21._M_node[9]._M_next = (_List_node_base *)pHVar31;
        (pHVar31->edges).super__List_base<CGL::Edge,_std::allocator<CGL::Edge>_>._M_impl._M_node.
        super__List_node_base._M_next = EVar21._M_node;
        ((_List_node_base *)(local_128.first + 0x30))->_M_next = EVar21._M_node;
        pHVar31 = (HalfedgeMesh *)
                  (pHVar31->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>.
                  _M_impl._M_node.super__List_node_base._M_prev;
        bVar36 = pHVar6 == pHVar31;
        if (bVar36) break;
        pHVar7 = (HalfedgeMesh *)
                 (pHVar31->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>.
                 _M_impl._M_node.super__List_node_base._M_next;
        while (pHVar7 != this) {
          pHVar31 = (HalfedgeMesh *)
                    (pHVar31->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>.
                    _M_impl._M_node.super__List_node_base._M_next[2]._M_next;
          bVar36 = pHVar6 == pHVar31;
          if (bVar36) goto LAB_0011d49a;
          pHVar7 = (HalfedgeMesh *)
                   (pHVar31->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>.
                   _M_impl._M_node.super__List_node_base._M_next;
        }
      } while (!bVar36);
LAB_0011d49a:
      if ((long)iStack_140._M_current - (long)local_148._M_node != 0) {
        uVar28 = (long)iStack_140._M_current - (long)local_148._M_node >> 3;
        lVar33 = 0;
        do {
          (&(local_148._M_node)->_M_next)[lVar33][2]._M_next =
               (&(local_148._M_node)->_M_next)[((uVar28 - 1) + lVar33) % uVar28];
          lVar33 = lVar33 + 1;
        } while (uVar28 + (uVar28 == 0) != lVar33);
      }
      if (local_148._M_node != (_List_node_base *)0x0) {
        operator_delete(local_148._M_node);
      }
    }
    p_Var24 = local_110;
    pvVar12 = local_c8;
  }
  p_Var29 = p_Var24->_M_next;
  while (p_Var29 != p_Var24) {
    p_Var29[0x14]._M_next = p_Var29[0x14]._M_next[1]._M_prev[2]._M_next;
    p_Var29 = p_Var29->_M_next;
  }
  local_148._M_node = p_Var24->_M_next;
  p_Var3 = &local_a0._M_impl.super__Rb_tree_header;
  if (local_148._M_node != p_Var24) {
    do {
      if ((HalfedgeMesh *)local_148._M_node[0x14]._M_next == this) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: some vertices are not referenced by any polygon."
                   ,0x5c);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0011d861;
      }
      mVar32 = 0;
      p_Var29 = local_148._M_node[0x14]._M_next;
      do {
        mVar32 = mVar32 + ((ulong)*(byte *)&p_Var29[3]._M_prev[10]._M_prev ^ 1);
        p_Var29 = p_Var29[1]._M_prev[2]._M_next;
      } while (local_148._M_node[0x14]._M_next != p_Var29);
      pmVar16 = std::
                map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
                ::operator[]((map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
                              *)&local_60,&local_148);
      if (mVar32 != *pmVar16) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: at least one of the vertices is nonmanifold."
                   ,0x58);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0011d861;
      }
      local_148._M_node = (local_148._M_node)->_M_next;
    } while (local_148._M_node != p_Var24);
  }
  pvVar14 = local_100;
  if ((long)(local_100->super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(local_100->super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>)._M_impl.
            super__Vector_impl_data._M_start >> 5 ==
      (this->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl._M_node.
      _M_size) {
    p_Var29 = p_Var24;
    if ((_Rb_tree_header *)local_a0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3) {
      lVar33 = 0;
      uVar28 = 0;
      p_Var19 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        p_Var26 = p_Var19[1]._M_parent;
        puVar2 = (undefined8 *)
                 ((long)&((pvVar14->
                          super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>)._M_impl
                          .super__Vector_impl_data._M_start)->field_0 + lVar33 * 2);
        p_Var9 = (_Base_ptr)puVar2[1];
        p_Var10 = (_Base_ptr)puVar2[2];
        p_Var11 = (_Base_ptr)puVar2[3];
        *(undefined8 *)(p_Var26 + 1) = *puVar2;
        p_Var26[1]._M_parent = p_Var9;
        p_Var26[1]._M_left = p_Var10;
        p_Var26[1]._M_right = p_Var11;
        pVVar8 = (pvVar12->super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if (uVar28 < (ulong)((long)(pvVar12->
                                   super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar8 >> 4))
        {
          puVar2 = (undefined8 *)((long)&pVVar8->x + lVar33);
          p_Var9 = (_Base_ptr)puVar2[1];
          p_Var26[5]._M_left = (_Base_ptr)*puVar2;
          p_Var26[5]._M_right = p_Var9;
        }
        uVar28 = uVar28 + 1;
        p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
        lVar33 = lVar33 + 0x10;
      } while ((_Rb_tree_header *)p_Var19 != p_Var3);
    }
    while (p_Var29 = p_Var29->_M_next, p_Var29 != p_Var24) {
      Vertex::computeNormal((Vertex *)(p_Var29 + 1));
    }
    std::
    _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
    ::~_Rb_tree(&local_f8);
    std::
    _Rb_tree<std::_List_iterator<CGL::Vertex>,_std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>,_std::_Select1st<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
    ::~_Rb_tree(&local_a0);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Error converting polygons to halfedge mesh: number of vertex positions is different from the number of distinct vertices!"
             ,0x79);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"(number of positions in input: ",0x1f);
  poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,")",1);
  std::endl<char,std::char_traits<char>>(poVar25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"(  number of vertices in mesh: ",0x1f);
  poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,")",1);
  std::endl<char,std::char_traits<char>>(poVar25);
LAB_0011d861:
  exit(1);
}

Assistant:

void HalfedgeMesh::build(const vector<vector<Index> >& polygons,
                         const vector<Vector3D>& vertexPositions,
                         const vector<Vector2D>& texcoords)
// This method initializes the halfedge data structure from a raw list of
// polygons, where each input polygon is specified as a list of vertex indices.
// The input must describe a manifold, oriented surface, where the orientation
// of a polygon is determined by the order of vertices in the list. Polygons
// must have at least three vertices.  Note that there are no special conditions
// on the vertex indices, i.e., they do not have to start at 0 or 1, nor does
// the collection of indices have to be contiguous.  Overall, this initializer
// is designed to be robust but perhaps not incredibly fast (though of course
// this does not affect the performance of the resulting data structure).  One
// could also implement faster initializers that handle important special cases
// (e.g., all triangles, or data that is known to be manifold). Since there are
// no strong conditions on the indices of polygons, we assume that the list of
// vertex positions is given in lexicographic order (i.e., that the lowest index
// appearing in any polygon corresponds to the first entry of the list of
// positions and so on).
{
  // define some types, to improve readability
  typedef vector<Index> IndexList;
  typedef IndexList::const_iterator IndexListCIter;
  typedef vector<IndexList> PolygonList;
  typedef PolygonList::const_iterator PolygonListCIter;
  typedef pair<Index, Index> IndexPair;  // ordered pair of vertex indices,
                                         // corresponding to an edge of an
                                         // oriented polygon

  // Clear any existing elements.
  halfedges.clear();
  vertices.clear();
  edges.clear();
  faces.clear();
  boundaries.clear();

  // Since the vertices in our halfedge mesh are stored in a linked list,
  // we will temporarily need to keep track of the correspondence between
  // indices of vertices in our input and pointers to vertices in the new
  // mesh (which otherwise can't be accessed by index).  Note that since
  // we're using a general-purpose map (rather than, say, a vector), we can
  // be a bit more flexible about the indexing scheme: input vertex indices
  // aren't required to be 0-based or 1-based; in fact, the set of indices
  // doesn't even have to be contiguous.  Taking advantage of this fact makes
  // our conversion a bit more robust to different types of input, including
  // data that comes from a subset of a full mesh.

  // maps a vertex index to the corresponding vertex
  map<Index, VertexIter> indexToVertex;

  // Also store the vertex degree, i.e., the number of polygons that use each
  // vertex; this information will be used to check that the mesh is manifold.
  map<VertexIter, Size> vertexDegree;

  // First, we do some basic sanity checks on the input.
  for (PolygonListCIter p = polygons.begin(); p != polygons.end(); p++) {
    if (p->size() < 3) {
      // Refuse to build the mesh if any of the polygons have fewer than three
      // vertices.(Note that if we omit this check the code will still
      // constructsomething fairlymeaningful for 1- and 2-point polygons, but
      // enforcing this stricterrequirementon the input will help simplify code
      // further downstream, since it canbe certainit doesn't have to check for
      // these rather degenerate cases.)
      cerr << "Error converting polygons to halfedge mesh: each polygon must "
              "have at least three vertices." << endl;
      exit(1);
    }

    // We want to count the number of distinct vertex indices in this
    // polygon, to make sure it's the same as the number of vertices
    // in the polygon---if they disagree, then the polygon is not valid
    // (or at least, for simplicity we don't handle polygons of this type!).
    set<Index> polygonIndices;

    // loop over polygon vertices
    for (IndexListCIter i = p->begin(); i != p->end(); i++) {
      polygonIndices.insert(*i);

      // allocate one vertex for each new index we encounter
      if (indexToVertex.find(*i) == indexToVertex.end()) {
        VertexIter v = newVertex();
        v->halfedge() =
            halfedges.end();  // this vertex doesn't yet point to any halfedge
        indexToVertex[*i] = v;
        vertexDegree[v] = 1;  // we've now seen this vertex only once
      } else {
        // keep track of the number of times we've seen this vertex
        vertexDegree[indexToVertex[*i]]++;
      }

    }  // end loop over polygon vertices

    // check that all vertices of the current polygon are distinct
    Size degree = p->size();  // number of vertices in this polygon
    if (polygonIndices.size() < degree) {
      cerr << "Error converting polygons to halfedge mesh: one of the input "
              "polygons does not have distinct vertices!" << endl;
      cerr << "(vertex indices:";
      for (IndexListCIter i = p->begin(); i != p->end(); i++) {
        cerr << " " << *i;
      }
      cerr << ")" << endl;
      exit(1);
    }  // end check that polygon vertices are distinct

  }  // end basic sanity checks on input

  // The number of vertices in the mesh is the
  // number of unique indices seen in the input.
  Size nVertices = indexToVertex.size();

  // The number of faces is just the number of polygons in the input.
  Size nFaces = polygons.size();
  faces.resize(nFaces);  // allocate storage for faces in our new mesh

  // We will store a map from ordered pairs of vertex indices to
  // the corresponding halfedge object in our new (halfedge) mesh;
  // this map gets constructed during the next loop over polygons.
  map<IndexPair, HalfedgeIter> pairToHalfedge;

  // Next, we actually build the halfedge connectivity by again looping over
  // polygons
  PolygonListCIter p;
  FaceIter f;
  for (p = polygons.begin(), f = faces.begin(); p != polygons.end(); p++, f++) {
    vector<HalfedgeIter> faceHalfedges;  // cyclically ordered list of the half
                                         // edges of this face
    Size degree = p->size();             // number of vertices in this polygon

    // loop over the halfedges of this face (equivalently, the ordered pairs of
    // consecutive vertices)
    for (Index i = 0; i < degree; i++) {
      Index a = (*p)[i];                 // current index
      Index b = (*p)[(i + 1) % degree];  // next index, in cyclic order
      IndexPair ab(a, b);
      HalfedgeIter hab;

      // check if this halfedge already exists; if so, we have a problem!
      if (pairToHalfedge.find(ab) != pairToHalfedge.end()) {
        cerr << "Error converting polygons to halfedge mesh: found multiple "
                "oriented edges with indices (" << a << ", " << b << ")."
             << endl;
        cerr << "This means that either (i) more than two faces contain this "
                "edge (hence the surface is nonmanifold), or" << endl;
        cerr << "(ii) there are exactly two faces containing this edge, but "
                "they have the same orientation (hence the surface is" << endl;
        cerr << "not consistently oriented." << endl;
        exit(1);
      } else  // otherwise, the halfedge hasn't been allocated yet
      {
        // so, we point this vertex pair to a new halfedge
        hab = newHalfedge();
        pairToHalfedge[ab] = hab;

        // link the new halfedge to its face
        hab->face() = f;
        hab->face()->halfedge() = hab;

        // also link it to its starting vertex
        hab->vertex() = indexToVertex[a];
        hab->vertex()->halfedge() = hab;

        // keep a list of halfedges in this face, so that we can later
        // link them together in a loop (via their "next" pointers)
        faceHalfedges.push_back(hab);
      }

      // Also, check if the twin of this halfedge has already been constructed
      // (during construction of a different face).  If so, link the twins
      // together and allocate their shared halfedge.  By the end of this pass
      // over polygons, the only halfedges that will not have a twin will hence
      // be those that sit along the domain boundary.
      IndexPair ba(b, a);
      map<IndexPair, HalfedgeIter>::iterator iba = pairToHalfedge.find(ba);
      if (iba != pairToHalfedge.end()) {
        HalfedgeIter hba = iba->second;

        // link the twins
        hab->twin() = hba;
        hba->twin() = hab;

        // allocate and link their edge
        EdgeIter e = newEdge();
        hab->edge() = e;
        hba->edge() = e;
        e->halfedge() = hab;
      } else { // If we didn't find a twin...
        // ...mark this halfedge as being twinless by pointing
        // it to the end of the list of halfedges. If it remains
        // twinless by the end of the current loop over polygons,
        // it will be linked to a boundary face in the next pass.
        hab->twin() = halfedges.end();
      }

    }  // end loop over the current polygon's halfedges

    // Now that all the halfedges of this face have been allocated,
    // we can link them together via their "next" pointers.
    for (Index i = 0; i < degree; i++) {
      Index j =
          (i + 1) % degree;  // index of the next halfedge, in cyclic order
      faceHalfedges[i]->next() = faceHalfedges[j];
    }

  }  // done building basic halfedge connectivity

  // For each vertex on the boundary, advance its halfedge pointer to one that
  // is also on the boundary.
  for (VertexIter v = verticesBegin(); v != verticesEnd(); v++) {
    // loop over halfedges around vertex
    HalfedgeIter h = v->halfedge();
    do {
      if (h->twin() == halfedges.end()) {
        v->halfedge() = h;
        break;
      }

      h = h->twin()->next();
    } while (h != v->halfedge());  // end loop over halfedges around vertex

  }  // done advancing halfedge pointers for boundary vertices

  // Next we construct new faces for each boundary component.
  for (HalfedgeIter h = halfedgesBegin(); h != halfedgesEnd();
       h++)  // loop over all halfedges
  {
    // Any halfedge that does not yet have a twin is on the boundary of the
    // domain. If we follow the boundary around long enough we will of course
    // eventually make a closed loop; we can represent this boundary loop by a
    // new face. To make clear the distinction between faces and boundary loops,
    // the boundary face will (i) have a flag indicating that it is a boundary
    // loop, and (ii) be stored in a list of boundaries, rather than the usual
    // list of faces.  The reason we need the both the flag *and* the separate
    // list is that faces are often accessed in two fundamentally different
    // ways: either by (i) local traversal of the neighborhood of some mesh
    // element using the halfedge structure, or (ii) global traversal of all
    // faces (or boundary loops).
    if (h->twin() == halfedges.end()) {
      FaceIter b = newBoundary();
      vector<HalfedgeIter> boundaryHalfedges;  // keep a list of halfedges along
                                               // the boundary, so we can link
                                               // them together

      // We now need to walk around the boundary, creating new
      // halfedges and edges along the boundary loop as we go.
      HalfedgeIter i = h;
      do {
        // create a twin, which becomes a halfedge of the boundary loop
        HalfedgeIter t = newHalfedge();
        boundaryHalfedges.push_back(
            t);  // keep a list of all boundary halfedges, in cyclic order
        i->twin() = t;
        t->twin() = i;
        t->face() = b;
        t->vertex() = i->next()->vertex();

        // create the shared edge
        EdgeIter e = newEdge();
        e->halfedge() = i;
        i->edge() = e;
        t->edge() = e;

        // Advance i to the next halfedge along the current boundary loop
        // by walking around its target vertex and stopping as soon as we
        // find a halfedge that does not yet have a twin defined.
        i = i->next();
        while (i != h &&  // we're done if we end up back at the beginning of
                          // the loop
               i->twin() != halfedges.end())  // otherwise, we're looking for
                                              // the next twinless halfedge
                                              // along the loop
        {
          i = i->twin();
          i = i->next();
        }
      } while (i != h);

      // The only pointers that still need to be set are the "next" pointers of
      // the twins; these we can set from the list of boundary halfedges, but we
      // must use the opposite order from the order in the list, since the
      // orientation of the boundary loop is opposite the orientation of the
      // halfedges "inside" the domain boundary.
      Size degree = boundaryHalfedges.size();
      for (Index p = 0; p < degree; p++) {
        Index q = (p - 1 + degree) % degree;
        boundaryHalfedges[p]->next() = boundaryHalfedges[q];
      }

    }  // end construction of one of the boundary loops

    // Note that even though we are looping over all halfedges, we will still
    // construct the appropriate number of boundary loops (and not, say, one
    // loop per boundary halfedge).  The reason is that as we continue to
    // iterate through halfedges, we check whether their twin has been assigned,
    // and since new twins may have been assigned earlier in this loop, we will
    // end up skipping many subsequent halfedges.

  }  // done adding "virtual" faces corresponding to boundary loops

  // To make later traversal of the mesh easier, we will now advance the
  // halfedge
  // associated with each vertex such that it refers to the *first* non-boundary
  // halfedge, rather than the last one.
  for (VertexIter v = verticesBegin(); v != verticesEnd(); v++) {
    v->halfedge() = v->halfedge()->twin()->next();
  }

  // Finally, we check that all vertices are manifold.
  for (VertexIter v = vertices.begin(); v != vertices.end(); v++) {
    // First check that this vertex is not a "floating" vertex;
    // if it is then we do not have a valid 2-manifold surface.
    if (v->halfedge() == halfedges.end()) {
      cerr << "Error converting polygons to halfedge mesh: some vertices are "
              "not referenced by any polygon." << endl;
      exit(1);
    }

    // Next, check that the number of halfedges emanating from this vertex in
    // our half edge data structure equals the number of polygons containing
    // this vertex, which we counted during our first pass over the mesh.  If
    // not, then our vertex is not a "fan" of polygons, but instead has some
    // other (nonmanifold) structure.
    Size count = 0;
    HalfedgeIter h = v->halfedge();
    do {
      if (!h->face()->isBoundary()) {
        count++;
      }
      h = h->twin()->next();
    } while (h != v->halfedge());

    if (count != vertexDegree[v]) {
      cerr << "Error converting polygons to halfedge mesh: at least one of the "
              "vertices is nonmanifold." << endl;
      exit(1);
    }
  }  // end loop over vertices

  // Now that we have the connectivity, we copy the list of vertex
  // positions into member variables of the individual vertices.
  if (vertexPositions.size() != vertices.size()) {
    cerr << "Error converting polygons to halfedge mesh: number of vertex "
            "positions is different from the number of distinct vertices!"
         << endl;
    cerr << "(number of positions in input: " << vertexPositions.size() << ")"
         << endl;
    cerr << "(  number of vertices in mesh: " << vertices.size() << ")" << endl;
    exit(1);
  }
  // Since an STL map internally sorts its keys, we can iterate over the map
  // from vertex indices to vertex iterators to visit our (input) vertices in
  // lexicographic order
  int i = 0;
  for (map<Index, VertexIter>::const_iterator e = indexToVertex.begin();
       e != indexToVertex.end(); e++) {
    // grab a pointer to the vertex associated with the current key (i.e., the
    // current index)
    VertexIter v = e->second;

    // set the att of this vertex to the corresponding
    // position in the input
    v->position = vertexPositions[i];

    if (texcoords.size() > i) {
        v->texcoord = texcoords[i];
//        printf("%f %f\n", v->texcoord.x, v->texcoord.y);
    }

    i++;
  }

  // compute initial normals
  for (VertexIter v = verticesBegin(); v != verticesEnd(); v++) {
    v->computeNormal();
  }

}